

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O0

void __thiscall wasm::InstrumentMemory::visitLoad(InstrumentMemory *this,Load *curr)

{
  pointer *ppuVar1;
  initializer_list<wasm::Expression_*> __l;
  Name target_00;
  initializer_list<wasm::Expression_*> __l_00;
  Name target_01;
  BasicType BVar2;
  Module *pMVar3;
  Memory *pMVar4;
  Call *pCVar5;
  PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_> *this_00;
  allocator<wasm::Expression_*> local_131;
  Const *local_130;
  Module *local_128;
  Const **local_120;
  size_type local_118;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_110;
  size_t local_f8;
  char *pcStack_f0;
  undefined1 auStack_e0 [8];
  Name target;
  allocator<wasm::Expression_*> local_b1;
  Const *local_b0;
  Const *local_a8;
  Const *local_a0;
  pointer local_98;
  Const **local_90;
  size_type local_88;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_80;
  size_t local_68;
  char *pcStack_60;
  uintptr_t local_50;
  Const *local_48;
  Const *offset;
  Type indexType;
  Memory *mem;
  Builder builder;
  Load *curr_local;
  InstrumentMemory *this_local;
  
  this->id = this->id + 1;
  this_00 = &(this->
             super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
             ).
             super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>;
  builder.wasm = (Module *)curr;
  pMVar3 = Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>::getModule
                     (&this_00->
                       super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>
                     );
  Builder::Builder((Builder *)&mem,pMVar3);
  pMVar3 = Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>::getModule
                     (&this_00->
                       super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>
                     );
  ppuVar1 = &((builder.wasm)->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  indexType.id = (uintptr_t)*ppuVar1;
  pMVar4 = Module::getMemory(pMVar3,(IString)*(IString *)ppuVar1);
  local_50 = (pMVar4->indexType).id;
  offset = (Const *)local_50;
  local_48 = Builder::makeConstPtr
                       ((Builder *)&mem,
                        (uint64_t)
                        ((builder.wasm)->functions).
                        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(Type)local_50);
  local_68 = load_ptr;
  pcStack_60 = DAT_027e52c0;
  local_b0 = Builder::makeConst<int>((Builder *)&mem,this->id);
  local_a8 = Builder::makeConst<int>
                       ((Builder *)&mem,
                        (uint)*(byte *)&((builder.wasm)->exports).
                                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_a0 = local_48;
  local_98 = ((builder.wasm)->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_90 = &local_b0;
  local_88 = 4;
  std::allocator<wasm::Expression_*>::allocator(&local_b1);
  __l_00._M_len = local_88;
  __l_00._M_array = (iterator)local_90;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_80,__l_00,&local_b1);
  target.super_IString.str._M_str = (char *)offset;
  target_01.super_IString.str._M_str = pcStack_60;
  target_01.super_IString.str._M_len = local_68;
  pCVar5 = Builder::makeCall((Builder *)&mem,target_01,&local_80,(Type)offset,false);
  ((builder.wasm)->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar5;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_80);
  std::allocator<wasm::Expression_*>::~allocator(&local_b1);
  wasm::Name::Name((Name *)auStack_e0);
  BVar2 = wasm::Type::getBasic
                    ((Type *)&((builder.wasm)->exports).
                              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
  switch(BVar2) {
  case i32:
    wasm::Name::operator=((Name *)auStack_e0,(Name *)&load_val_i32);
    break;
  case i64:
    wasm::Name::operator=((Name *)auStack_e0,(Name *)&load_val_i64);
    break;
  case f32:
    wasm::Name::operator=((Name *)auStack_e0,(Name *)&load_val_f32);
    break;
  case f64:
    wasm::Name::operator=((Name *)auStack_e0,(Name *)&load_val_f64);
    break;
  default:
    goto switchD_017a810e_default;
  }
  local_f8 = (size_t)auStack_e0;
  pcStack_f0 = (char *)target.super_IString.str._M_len;
  local_130 = Builder::makeConst<int>((Builder *)&mem,this->id);
  local_128 = builder.wasm;
  local_120 = &local_130;
  local_118 = 2;
  std::allocator<wasm::Expression_*>::allocator(&local_131);
  __l._M_len = local_118;
  __l._M_array = (iterator)local_120;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_110,__l,&local_131);
  target_00.super_IString.str._M_str = pcStack_f0;
  target_00.super_IString.str._M_len = local_f8;
  pCVar5 = Builder::makeCall((Builder *)&mem,target_00,&local_110,
                             (Type)((builder.wasm)->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,false);
  Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
              ).
              super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>
              .super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>,
             (Expression *)pCVar5);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_110);
  std::allocator<wasm::Expression_*>::~allocator(&local_131);
switchD_017a810e_default:
  return;
}

Assistant:

void visitLoad(Load* curr) {
    id++;
    Builder builder(*getModule());
    auto mem = getModule()->getMemory(curr->memory);
    auto indexType = mem->indexType;
    auto offset = builder.makeConstPtr(curr->offset.addr, indexType);
    curr->ptr = builder.makeCall(load_ptr,
                                 {builder.makeConst(int32_t(id)),
                                  builder.makeConst(int32_t(curr->bytes)),
                                  offset,
                                  curr->ptr},
                                 indexType);
    Name target;
    switch (curr->type.getBasic()) {
      case Type::i32:
        target = load_val_i32;
        break;
      case Type::i64:
        target = load_val_i64;
        break;
      case Type::f32:
        target = load_val_f32;
        break;
      case Type::f64:
        target = load_val_f64;
        break;
      default:
        return; // TODO: other types, unreachable, etc.
    }
    replaceCurrent(builder.makeCall(
      target, {builder.makeConst(int32_t(id)), curr}, curr->type));
  }